

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEPlanet.cpp
# Opt level: O1

CEPlanet * CEPlanet::Jupiter(void)

{
  CEPlanet *in_RDI;
  allocator local_69;
  CEAngle local_68;
  CEAngle local_58;
  CESkyCoordType local_44;
  string local_40;
  double local_20;
  double local_18;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"Jupiter",&local_69);
  local_18 = 0.0;
  CEAngle::CEAngle(&local_58,&local_18);
  local_20 = 0.0;
  CEAngle::CEAngle(&local_68,&local_20);
  local_44 = CIRS;
  CEPlanet(in_RDI,&local_40,&local_58,&local_68,&local_44);
  CEAngle::~CEAngle(&local_68);
  CEAngle::~CEAngle(&local_58);
  std::__cxx11::string::~string((string *)&local_40);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_69);
  SetSemiMajorAxis_AU(in_RDI,5.20248019,-2.864e-05);
  SetEccentricity(in_RDI,0.0485359,-5.107e-05);
  SetInclination(in_RDI,1.29861416,-0.00322699,DEGREES);
  SetMeanLongitude(in_RDI,34.33479152,3034.90371757,DEGREES);
  SetPerihelionLongitude(in_RDI,14.27495244,0.18199196,DEGREES);
  SetAscendingNodeLongitude(in_RDI,100.29282654,0.13024619,DEGREES);
  SetExtraTerms(in_RDI,-0.00012452,0.0606406,-0.35635438,38.35125);
  SetMeanRadius_m(in_RDI,69911000.0);
  SetAlbedo(in_RDI,0.52);
  SetMass_kg(in_RDI,1.89813e+27);
  local_40._M_dataplus._M_p = (pointer)0x4014000000000000;
  SetSofaID(in_RDI,(double *)&local_40);
  return in_RDI;
}

Assistant:

CEPlanet CEPlanet::Jupiter()
{
    CEPlanet jupiter("Jupiter", 0.0, 0.0) ;
    jupiter.SetSemiMajorAxis_AU(5.20248019, -0.00002864) ;
    jupiter.SetEccentricity(0.04853590, -0.00005107) ;
    jupiter.SetInclination(1.29861416, -0.00322699, CEAngleType::DEGREES) ;
    jupiter.SetMeanLongitude(34.33479152, 3034.90371757, CEAngleType::DEGREES) ;
    jupiter.SetPerihelionLongitude(14.27495244, 0.18199196, CEAngleType::DEGREES) ;
    jupiter.SetAscendingNodeLongitude(100.29282654, 0.13024619, CEAngleType::DEGREES) ;
    
    jupiter.SetExtraTerms(-0.00012452, 0.06064060, -0.35635438, 38.35125000) ;
    
    // Set planetary properties
    jupiter.SetMeanRadius_m(69911000.0) ;
    jupiter.SetAlbedo(0.52) ;
    jupiter.SetMass_kg(1.89813E27) ;
    
    // Set the sofa planet ID
    jupiter.SetSofaID(5) ;
    
    return jupiter ;
}